

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArraySamplingTest::setupSharedStorageBuffers
          (TextureCubeMapArraySamplingTest *this,formatDefinition *format,
          samplingFunction *sampling_function,bufferCollection *buffers,GLuint program_id)

{
  samplerType sVar1;
  ulong uVar2;
  bufferCollection *pbVar3;
  long lVar4;
  attributeDefinition *paVar5;
  attributeDefinition *paVar6;
  attributeDefinition *attribute;
  bool bVar7;
  
  sVar1 = format->m_sampler_type;
  paVar6 = (attributeDefinition *)0x0;
  paVar5 = getAttributes::depth_attributes;
  if (sVar1 != Depth) {
    paVar5 = paVar6;
  }
  uVar2 = (ulong)*sampling_function;
  attribute = (attributeDefinition *)0x0;
  pbVar3 = buffers;
  if (uVar2 < 4) {
    paVar6 = *(attributeDefinition **)(&DAT_017c67d8 + uVar2 * 8);
    attribute = (attributeDefinition *)(&PTR_texture_attributes_01dfc838)[uVar2];
    pbVar3 = (bufferCollection *)&PTR_texture_attributes_01dfc838;
  }
  while( true ) {
    bVar7 = paVar6 == (attributeDefinition *)0x0;
    paVar6 = (attributeDefinition *)((long)&paVar6[-1].binding + 3);
    if (bVar7) break;
    setupSharedStorageBuffer(this,attribute,buffers,(GLuint)pbVar3);
    attribute = attribute + 1;
  }
  if (sVar1 == Depth) {
    bVar7 = true;
    lVar4 = 0;
    while (bVar7) {
      setupSharedStorageBuffer(this,paVar5 + lVar4,buffers,(GLuint)lVar4);
      bVar7 = false;
      lVar4 = 1;
    }
  }
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::setupSharedStorageBuffers(const formatDefinition& format,
																const samplingFunction& sampling_function,
																const bufferCollection& buffers, glw::GLuint program_id)
{
	const attributeDefinition* format_attributes	= 0;
	glw::GLuint				   n_format_attributes  = 0;
	glw::GLuint				   n_routine_attributes = 0;
	const attributeDefinition* routine_attributes   = 0;

	getAttributes(format.m_sampler_type, format_attributes, n_format_attributes);
	getAttributes(sampling_function, routine_attributes, n_routine_attributes);

	for (glw::GLuint i = 0; i < n_routine_attributes; ++i)
	{
		setupSharedStorageBuffer(routine_attributes[i], buffers, program_id);
	}

	for (glw::GLuint i = 0; i < n_format_attributes; ++i)
	{
		setupSharedStorageBuffer(format_attributes[i], buffers, program_id);
	}
}